

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O1

void __thiscall
geometrycentral::NearestNeighborFinder::NearestNeighborFinder
          (NearestNeighborFinder *this,
          vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *points)

{
  _Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false> __ptr_00;
  _Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false> this_00;
  pointer *__ptr;
  
  (this->impl)._M_t.
  super___uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  .super__Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false>._M_head_impl =
       (KNNImpl *)0x0;
  this_00._M_head_impl = (KNNImpl *)operator_new(200);
  KNNImpl::KNNImpl(this_00._M_head_impl,points);
  __ptr_00._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
       .super__Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false>._M_head_impl
  ;
  (this->impl)._M_t.
  super___uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  .super__Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (__ptr_00._M_head_impl != (KNNImpl *)0x0) {
    std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>::operator()
              ((default_delete<geometrycentral::NearestNeighborFinder::KNNImpl> *)this,
               __ptr_00._M_head_impl);
    return;
  }
  return;
}

Assistant:

NearestNeighborFinder::NearestNeighborFinder(const std::vector<Vector3>& points) { impl.reset(new KNNImpl(points)); }